

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::ModfCase::compare(ModfCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  ostringstream *this_00;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  deUint32 bBits;
  deUint32 u32;
  float fVar13;
  Hex<8UL> local_70;
  HexFloat local_64;
  HexFloat local_60;
  HexFloat local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar11 = (int)uVar4 < 1;
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + uVar10 * 4);
      fVar13 = fVar1 - (float)(int)fVar1;
      iVar6 = 0;
      if (PVar2 != PRECISION_HIGHP) {
        iVar8 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7f;
        iVar6 = iVar8;
        if (((uint)fVar1 & 0x7fffff) != 0) {
          iVar6 = -0x7e;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar6 = iVar8;
        }
        iVar9 = ((uint)fVar13 >> 0x17 & 0xff) - 0x7f;
        iVar8 = iVar9;
        if (((uint)fVar13 & 0x7fffff) != 0) {
          iVar8 = -0x7e;
        }
        if (((uint)fVar13 & 0x7f800000) != 0) {
          iVar8 = iVar9;
        }
        iVar6 = iVar6 - iVar8;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
      }
      iVar6 = *(int *)(&DAT_01c9564c + (ulong)PVar2 * 4) - iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      fVar12 = *(float *)((long)outputs[1] + uVar10 * 4) + *(float *)((long)*outputs + uVar10 * 4);
      if (PVar2 == PRECISION_HIGHP) {
LAB_014c8fbe:
        fVar7 = (float)((int)fVar1 - (int)fVar12);
        if ((uint)fVar1 < (uint)fVar12) {
          fVar7 = (float)-((int)fVar1 - (int)fVar12);
        }
      }
      else if ((fVar12 != 0.0) || (NAN(fVar12))) {
        if ((fVar1 != 0.0) || (NAN(fVar1))) goto LAB_014c8fbe;
        fVar7 = ABS(fVar12);
      }
      else {
        fVar7 = ABS(fVar1);
      }
      fVar12 = (float)~(-1 << (0x17U - (char)iVar6 & 0x1f));
      if ((uint)fVar12 < (uint)fVar7) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        local_48 = ZEXT416((uint)(float)(int)fVar1);
        local_58 = ZEXT416((uint)fVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = (",5);
        local_5c.value = (float)local_58._0_4_;
        poVar5 = Functional::operator<<(poVar5,&local_5c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") + (",5);
        local_60.value = (float)local_48._0_4_;
        poVar5 = Functional::operator<<(poVar5,&local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") = ",4);
        local_64.value = fVar1;
        poVar5 = Functional::operator<<(poVar5,&local_64);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ULP threshold ",0x14);
        local_70.value = (deUint64)(uint)fVar12;
        poVar5 = tcu::Format::Hex<8UL>::toStream(&local_70,poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
        local_70.value = (deUint64)(uint)fVar7;
        tcu::Format::Hex<8UL>::toStream(&local_70,poVar5);
        return bVar11;
      }
      uVar10 = uVar10 + 1;
      bVar11 = uVar4 <= uVar10;
    } while (uVar10 != uVar4);
  }
  return bVar11;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		out1		= ((const float*)outputs[1])[compNdx];

			const float		refOut1		= float(int(in0));
			const float		refOut0		= in0 - refOut1;

			const int		bitsLost	= precision != glu::PRECISION_HIGHP ? numBitsLostInOp(in0, refOut0) : 0;
			const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(mantissaBits - bitsLost, 0));

			const float		resSum		= out0 + out1;

			const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(resSum, in0) : getUlpDiffIgnoreZeroSign(resSum, in0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = (" << HexFloat(refOut0) << ") + (" << HexFloat(refOut1) << ") = " << HexFloat(in0) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}